

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O0

HighsStatus
assessMatrixDimensions
          (HighsLogOptions *log_options,HighsInt num_vec,bool partitioned,
          vector<int,_std::allocator<int>_> *matrix_start,
          vector<int,_std::allocator<int>_> *matrix_p_end,
          vector<int,_std::allocator<int>_> *matrix_index,
          vector<double,_std::allocator<double>_> *matrix_value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  uint *puVar5;
  vector<int,_std::allocator<int>_> *in_RCX;
  byte in_DL;
  uint in_ESI;
  HighsLogOptions *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  bool legal_matrix_value_size;
  bool legal_matrix_index_size;
  HighsInt num_nz;
  bool legal_matrix_p_end_size;
  bool legal_matrix_start_size;
  bool legal_num_vec;
  bool ok;
  uint local_60;
  bool local_49;
  HighsStatus local_4;
  
  if (-1 >= (int)in_ESI) {
    highsLogUser(in_RDI,kError,"Matrix dimension validation fails on number of vectors = %d < 0\n",
                 (ulong)in_ESI);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  bVar1 = (int)(in_ESI + 1) <= (int)sVar4;
  if (!bVar1) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
    highsLogUser(in_RDI,kError,
                 "Matrix dimension validation fails on start size = %d < %d = num vectors + 1\n",
                 sVar4 & 0xffffffff,(ulong)(in_ESI + 1));
  }
  local_49 = bVar1 && -1 < (int)in_ESI;
  bVar2 = local_49;
  if ((in_DL & 1) != 0) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(in_R8);
    if ((int)sVar4 < (int)(in_ESI + 1)) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size(in_R8);
      highsLogUser(in_RDI,kError,
                   "Matrix dimension validation fails on p_end size = %d < %d = num vectors + 1\n",
                   sVar4 & 0xffffffff,(ulong)(in_ESI + 1));
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size(in_R8);
    bVar2 = false;
    if ((int)(in_ESI + 1) <= (int)sVar4) {
      bVar2 = local_49;
    }
  }
  if (bVar1) {
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)(int)in_ESI);
    local_60 = *puVar5;
  }
  else {
    local_60 = 0;
  }
  if ((int)local_60 < 0) {
    highsLogUser(in_RDI,kError,"Matrix dimension validation fails on number of nonzeros = %d < 0\n",
                 (ulong)local_60);
    bVar1 = false;
  }
  else {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(in_R9);
    bVar1 = (int)local_60 <= (int)sVar4;
    if (!bVar1) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size(in_R9);
      highsLogUser(in_RDI,kError,
                   "Matrix dimension validation fails on index size = %d < %d = number of nonzeros\n"
                   ,sVar4 & 0xffffffff,(ulong)local_60);
    }
    bVar3 = false;
    if (bVar1) {
      bVar3 = bVar2;
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size(in_stack_00000008);
    bVar2 = (int)local_60 <= (int)sVar4;
    if (!bVar2) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size(in_stack_00000008);
      highsLogUser(in_RDI,kError,
                   "Matrix dimension validation fails on value size = %d < %d = number of nonzeros\n"
                   ,sVar4 & 0xffffffff,(ulong)local_60);
    }
    bVar1 = false;
    if (bVar2) {
      bVar1 = bVar3;
    }
  }
  if (bVar1) {
    local_4 = kOk;
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus assessMatrixDimensions(const HighsLogOptions& log_options,
                                   const HighsInt num_vec,
                                   const bool partitioned,
                                   const vector<HighsInt>& matrix_start,
                                   const vector<HighsInt>& matrix_p_end,
                                   const vector<HighsInt>& matrix_index,
                                   const vector<double>& matrix_value) {
  bool ok = true;
  // Assess main dimensions
  const bool legal_num_vec = num_vec >= 0;
  if (!legal_num_vec)
    highsLogUser(
        log_options, HighsLogType::kError,
        "Matrix dimension validation fails on number of vectors = %d < 0\n",
        (int)num_vec);
  ok = legal_num_vec && ok;
  const bool legal_matrix_start_size =
      (HighsInt)matrix_start.size() >= num_vec + 1;
  if (!legal_matrix_start_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "Matrix dimension validation fails on start size = %d < %d = "
                 "num vectors + 1\n",
                 (int)matrix_start.size(), (int)(num_vec + 1));
  ok = legal_matrix_start_size && ok;
  if (partitioned) {
    const bool legal_matrix_p_end_size =
        (HighsInt)matrix_p_end.size() >= num_vec + 1;
    if (!legal_matrix_p_end_size)
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix dimension validation fails on p_end size = %d < %d "
                   "= num vectors + 1\n",
                   (int)matrix_p_end.size(), (int)(num_vec + 1));
    ok = (HighsInt)matrix_p_end.size() >= num_vec + 1 && ok;
  }
  // Possibly check the sizes of the index and value vectors. Can only
  // do this with the number of nonzeros, and this is only known if
  // the start vector has a legal size. Setting num_nz = 0 otherwise
  // means that all tests pass, as they just check that the sizes of
  // the index and value vectors are non-negative.
  const HighsInt num_nz = legal_matrix_start_size ? matrix_start[num_vec] : 0;
  if (num_nz >= 0) {
    const bool legal_matrix_index_size =
        (HighsInt)matrix_index.size() >= num_nz;
    if (!legal_matrix_index_size)
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix dimension validation fails on index size = %d < %d "
                   "= number of nonzeros\n",
                   (int)matrix_index.size(), (int)num_nz);
    ok = legal_matrix_index_size && ok;
    const bool legal_matrix_value_size =
        (HighsInt)matrix_value.size() >= num_nz;
    if (!legal_matrix_value_size)
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix dimension validation fails on value size = %d < %d "
                   "= number of nonzeros\n",
                   (int)matrix_value.size(), (int)num_nz);
    ok = legal_matrix_value_size && ok;
  } else {
    highsLogUser(
        log_options, HighsLogType::kError,
        "Matrix dimension validation fails on number of nonzeros = %d < 0\n",
        (int)num_nz);
    ok = false;
  }
  if (ok) return HighsStatus::kOk;
  return HighsStatus::kError;
}